

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int unquantize_i4r8(long row,int *input,long ntodo,double scale,double zero,int dither_method,
                   int nullcheck,int tnull,double nullval,char *nullarray,int *anynull,
                   double *output,int *status)

{
  int iVar1;
  int local_60;
  int local_5c;
  int iseed;
  int nextrand;
  long ii;
  double nullval_local;
  int tnull_local;
  int nullcheck_local;
  int dither_method_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  int *input_local;
  long row_local;
  
  if ((fits_rand_value == (float *)0x0) && (iVar1 = fits_init_randoms(), iVar1 != 0)) {
    row_local._4_4_ = 0x71;
  }
  else {
    local_60 = (int)((row + -1) % 10000);
    local_5c = (int)(fits_rand_value[local_60] * 500.0);
    if (nullcheck == 0) {
      for (_iseed = 0; _iseed < ntodo; _iseed = _iseed + 1) {
        if ((dither_method == 2) && (input[_iseed] == -0x7ffffffe)) {
          output[_iseed] = 0.0;
        }
        else {
          output[_iseed] =
               (((double)input[_iseed] - (double)fits_rand_value[local_5c]) + 0.5) * scale + zero;
        }
        local_5c = local_5c + 1;
        if (local_5c == 10000) {
          local_60 = local_60 + 1;
          if (local_60 == 10000) {
            local_60 = 0;
          }
          local_5c = (int)(fits_rand_value[local_60] * 500.0);
        }
      }
    }
    else {
      for (_iseed = 0; _iseed < ntodo; _iseed = _iseed + 1) {
        if (input[_iseed] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[_iseed] = nullval;
          }
          else {
            nullarray[_iseed] = '\x01';
          }
        }
        else if ((dither_method == 2) && (input[_iseed] == -0x7ffffffe)) {
          output[_iseed] = 0.0;
        }
        else {
          output[_iseed] =
               (((double)input[_iseed] - (double)fits_rand_value[local_5c]) + 0.5) * scale + zero;
        }
        local_5c = local_5c + 1;
        if (local_5c == 10000) {
          local_60 = local_60 + 1;
          if (local_60 == 10000) {
            local_60 = 0;
          }
          local_5c = (int)(fits_rand_value[local_60] * 500.0);
        }
      }
    }
    row_local._4_4_ = *status;
  }
  return row_local._4_4_;
}

Assistant:

static int unquantize_i4r8(long row, /* tile number = row number in table    */
            INT32BIT *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int dither_method,    /* I - dithering method to use             */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
            double nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            double *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
    Unquantize int integer values into the scaled floating point values
*/
{
    long ii;
    int nextrand, iseed;

    if (fits_rand_value == 0) 
       if (fits_init_randoms()) return(MEMORY_ALLOCATION);

    /* initialize the index to the next random number in the list */
    iseed = (int) ((row - 1) % N_RANDOM);
    nextrand = (int) (fits_rand_value[iseed] * 500);

    if (nullcheck == 0)     /* no null checking required */
    {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (dither_method == SUBTRACTIVE_DITHER_2 && input[ii] == ZERO_VALUE)
		    output[ii] = 0.0;
		else
                    output[ii] = (double) (((double) input[ii] - fits_rand_value[nextrand] + 0.5) * scale + zero);

	        nextrand++;
	        if (nextrand == N_RANDOM) {
	            iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
		    nextrand = (int) (fits_rand_value[iseed] * 500);
	        }
            }
    }
    else        /* must check for null values */
    {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    if (dither_method == SUBTRACTIVE_DITHER_2 && input[ii] == ZERO_VALUE)
		        output[ii] = 0.0;
		    else
                        output[ii] = (double) (((double) input[ii] - fits_rand_value[nextrand] + 0.5) * scale + zero);
                }

	        nextrand++;
	        if (nextrand == N_RANDOM) {
	            iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
		    nextrand = (int) (fits_rand_value[iseed] * 500);
	        }
            }
    }

    return(*status);
}